

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O1

void __thiscall
sf::priv::WindowImplX11::WindowImplX11
          (WindowImplX11 *this,VideoMode mode,String *title,unsigned_long style,
          ContextSettings *settings)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  bool bVar5;
  int iVar6;
  Display *pDVar7;
  Window WVar8;
  undefined8 *puVar9;
  Atom AVar10;
  _Alloc_hider __s;
  ssize_t sVar11;
  char *pcVar12;
  ostream *poVar13;
  byte *pbVar14;
  Pixmap PVar15;
  uint uVar16;
  long lVar17;
  allocator_type local_15d;
  uint local_15c;
  VideoMode local_158;
  string executableName;
  string ansiTitle;
  Vector2i local_f8;
  vector<char,_std::allocator<char>_> windowClass;
  vector<char,_std::allocator<char>_> windowInstance;
  long flags;
  XSetWindowAttributes attributes;
  
  local_158.bitsPerPixel = mode.bitsPerPixel;
  local_158._0_8_ = mode._0_8_;
  WindowImpl::WindowImpl(&this->super_WindowImpl);
  (this->super_WindowImpl)._vptr_WindowImpl = (_func_int **)&PTR__WindowImplX11_0027ec18;
  this->m_window = 0;
  this->m_screen = 0;
  this->m_inputMethod = (XIM)0x0;
  this->m_inputContext = (XIC)0x0;
  this->m_isExternal = false;
  this->m_oldVideoMode = 0;
  this->m_oldRRCrtc = 0;
  this->m_hiddenCursor = 0;
  this->m_lastCursor = 0;
  this->m_keyRepeat = true;
  (this->m_previousSize).x = -1;
  (this->m_previousSize).y = -1;
  this->m_useSizeHints = false;
  bVar5 = (bool)((byte)((style & 0xffffffff) >> 3) & 1);
  this->m_fullscreen = bVar5;
  this->m_cursorGrabbed = bVar5;
  *(undefined1 (*) [16])&this->m_windowMapped = (undefined1  [16])0x0;
  this->m_iconMaskPixmap = 0;
  this->m_lastInputTime = 0;
  pDVar7 = OpenDisplay();
  this->m_display = pDVar7;
  anon_unknown.dwarf_5b9478::WindowsImplX11Impl::ewmhSupported();
  iVar6 = *(int *)(this->m_display + 0xe0);
  this->m_screen = iVar6;
  if (this->m_fullscreen == true) {
    local_f8 = getPrimaryMonitorPosition(this);
  }
  else {
    uVar1 = *(undefined8 *)(*(long *)(this->m_display + 0xe8) + 0x18 + (long)iVar6 * 0x80);
    local_f8.x = ((int)uVar1 - local_158.width) / 2;
    local_f8.y = ((int)((ulong)uVar1 >> 0x20) - local_158.height) / 2;
  }
  uVar1 = local_158._0_8_;
  uVar4 = local_158.width;
  local_15c = local_158.height;
  if (settings->attributeFlags == 0xffffffff) {
    lVar17 = (long)this->m_screen * 0x80;
    PVar15 = *(Pixmap *)(*(long *)(this->m_display + 0xe8) + 0x40 + lVar17);
    uVar2 = *(undefined4 *)(*(long *)(this->m_display + 0xe8) + 0x38 + lVar17);
  }
  else {
    GlxContext::selectBestVisual
              ((XVisualInfo *)&attributes,this->m_display,local_158.bitsPerPixel,settings);
    PVar15 = attributes.background_pixmap;
    uVar2 = attributes.border_pixmap._4_4_;
  }
  pDVar7 = this->m_display;
  uVar16 = 0;
  attributes.colormap =
       XCreateColormap(pDVar7,*(undefined8 *)
                               (*(long *)(pDVar7 + 0xe8) + 0x10 +
                               (long)*(int *)(pDVar7 + 0xe0) * 0x80),PVar15,0);
  attributes.event_mask = 0x63207f;
  if (this->m_fullscreen == true) {
    bVar5 = anon_unknown.dwarf_5b9478::WindowsImplX11Impl::ewmhSupported();
    uVar16 = (uint)!bVar5;
  }
  pDVar7 = this->m_display;
  attributes.override_redirect = uVar16;
  WVar8 = XCreateWindow(pDVar7,*(undefined8 *)
                                (*(long *)(pDVar7 + 0xe8) + 0x10 +
                                (long)*(int *)(pDVar7 + 0xe0) * 0x80),(ulong)local_f8 & 0xffffffff,
                        local_f8.y,uVar1 & 0xffffffff,local_15c,0,uVar2,1,PVar15,0x2a00,&attributes)
  ;
  this->m_window = WVar8;
  if (WVar8 == 0) {
    poVar13 = err();
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"Failed to create window",0x17);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
  }
  else {
    setProtocols(this);
    puVar9 = (undefined8 *)XAllocWMHints();
    *puVar9 = 2;
    *(undefined4 *)((long)puVar9 + 0xc) = 1;
    XSetWMHints(this->m_display,this->m_window,puVar9);
    XFree(puVar9);
    if (this->m_fullscreen == false) {
      executableName._M_dataplus._M_p = (pointer)&executableName.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&executableName,"_MOTIF_WM_HINTS","");
      AVar10 = getAtom(&executableName,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)executableName._M_dataplus._M_p != &executableName.field_2) {
        operator_delete(executableName._M_dataplus._M_p);
      }
      if (AVar10 != 0) {
        executableName.field_2._8_8_ = 0;
        executableName._M_dataplus._M_p = (pointer)0x3;
        executableName._M_string_length._0_1_ = 0;
        executableName.field_2._M_allocated_capacity._0_4_ = 0;
        if ((style & 1) != 0) {
          executableName.field_2._M_allocated_capacity._0_4_ = 0x3a;
          executableName._M_string_length._0_1_ = 0xc;
        }
        if ((style & 2) != 0) {
          executableName._M_string_length._0_1_ = (byte)executableName._M_string_length | 0x12;
          executableName.field_2._M_allocated_capacity._0_4_ =
               executableName.field_2._M_allocated_capacity._0_4_ | 0x44;
        }
        executableName.field_2._M_allocated_capacity._4_4_ = 0;
        executableName._M_string_length._1_7_ = 0;
        if ((style & 4) != 0) {
          executableName._M_string_length._0_1_ = (byte)executableName._M_string_length | 0x20;
        }
        XChangeProperty(this->m_display,this->m_window,AVar10,AVar10,0x20,0,&executableName,5);
      }
    }
    if ((style & 2) == 0) {
      this->m_useSizeHints = true;
      puVar9 = (undefined8 *)XAllocSizeHints();
      *puVar9 = 0x31;
      *(uint *)(puVar9 + 4) = uVar4;
      *(uint *)(puVar9 + 3) = uVar4;
      *(uint *)((long)puVar9 + 0x24) = local_15c;
      *(uint *)((long)puVar9 + 0x1c) = local_15c;
      *(Vector2i *)(puVar9 + 1) = local_f8;
      XSetWMNormalHints(this->m_display,this->m_window,puVar9);
      XFree(puVar9);
    }
    puVar9 = (undefined8 *)XAllocClassHint();
    iVar6 = open("/proc/self/cmdline",0x800);
    if (iVar6 < 0) {
      executableName._M_dataplus._M_p = (pointer)&executableName.field_2;
      executableName.field_2._M_allocated_capacity._0_4_ = 0x6c6d6673;
      executableName._M_string_length._0_1_ = 4;
      executableName._M_string_length._1_7_ = 0;
      executableName.field_2._M_allocated_capacity._4_4_ =
           executableName.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
    }
    else {
      ansiTitle._M_dataplus._M_p = (pointer)0x0;
      ansiTitle._M_string_length = 0;
      ansiTitle.field_2._M_allocated_capacity = 0;
      __s._M_p = (pointer)operator_new(0x100);
      ansiTitle._M_string_length = (size_type)__s._M_p;
      ansiTitle._M_dataplus._M_p = __s._M_p;
      lVar17 = 0;
      ansiTitle.field_2._M_allocated_capacity = (size_type)(__s._M_p + 0x100);
      memset(__s._M_p,0,0x100);
      ansiTitle._M_string_length = (size_type)(__s._M_p + 0x100);
      while( true ) {
        sVar11 = read(iVar6,ansiTitle._M_dataplus._M_p + lVar17,0x100);
        if (sVar11 < 1) break;
        windowInstance.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = 0;
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)&ansiTitle,
                   (ansiTitle._M_string_length + sVar11) - (long)ansiTitle._M_dataplus._M_p,
                   (value_type *)&windowInstance);
        lVar17 = lVar17 + sVar11;
      }
      close(iVar6);
      if (lVar17 == 0) {
        executableName._M_dataplus._M_p = (pointer)&executableName.field_2;
        executableName.field_2._M_allocated_capacity._0_4_ = 0x6c6d6673;
        executableName._M_string_length._0_1_ = 4;
        executableName._M_string_length._1_7_ = 0;
        executableName.field_2._M_allocated_capacity._4_4_ =
             executableName.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
      }
      else {
        ansiTitle._M_dataplus._M_p[lVar17] = '\0';
        pcVar12 = __xpg_basename(ansiTitle._M_dataplus._M_p);
        std::__cxx11::string::string((string *)&executableName,pcVar12,(allocator *)&windowInstance)
        ;
      }
      if (ansiTitle._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(ansiTitle._M_dataplus._M_p);
      }
    }
    auVar3[0xf] = 0;
    auVar3._0_15_ = (undefined1  [15])ansiTitle._1_15_;
    ansiTitle._0_16_ = auVar3 << 8;
    std::vector<char,_std::allocator<char>_>::vector
              (&windowInstance,
               CONCAT71(executableName._M_string_length._1_7_,(byte)executableName._M_string_length)
               + 1,(value_type *)&ansiTitle,(allocator_type *)&windowClass);
    if (CONCAT71(executableName._M_string_length._1_7_,(byte)executableName._M_string_length) != 0)
    {
      memmove((void *)CONCAT71(windowInstance.super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               windowInstance.super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_),
              executableName._M_dataplus._M_p,
              CONCAT71(executableName._M_string_length._1_7_,(byte)executableName._M_string_length))
      ;
    }
    *puVar9 = CONCAT71(windowInstance.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start._1_7_,
                       windowInstance.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_1_);
    std::locale::locale((locale *)&windowClass);
    String::toAnsiString_abi_cxx11_(&ansiTitle,title,(locale *)&windowClass);
    std::locale::~locale((locale *)&windowClass);
    flags = flags & 0xffffffffffffff00;
    std::vector<char,_std::allocator<char>_>::vector
              (&windowClass,ansiTitle._M_string_length + 1,(value_type *)&flags,&local_15d);
    if (ansiTitle._M_string_length != 0) {
      memmove(windowClass.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start,ansiTitle._M_dataplus._M_p,ansiTitle._M_string_length
             );
    }
    puVar9[1] = windowClass.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
    XSetClassHint(this->m_display,this->m_window,puVar9);
    XFree(puVar9);
    (*(this->super_WindowImpl)._vptr_WindowImpl[7])(this,title);
    initialize(this);
    if (this->m_fullscreen == true) {
      pbVar14 = (byte *)XAllocSizeHints();
      flags = 0;
      XGetWMNormalHints(this->m_display,this->m_window,pbVar14);
      *pbVar14 = *pbVar14 & 0xcf;
      XSetWMNormalHints(this->m_display,this->m_window,pbVar14);
      XFree(pbVar14);
      setVideoMode(this,&local_158);
      switchToFullscreen(this);
    }
    if (windowClass.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(windowClass.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ansiTitle._M_dataplus._M_p != &ansiTitle.field_2) {
      operator_delete(ansiTitle._M_dataplus._M_p);
    }
    if ((void *)CONCAT71(windowInstance.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         windowInstance.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
      operator_delete((void *)CONCAT71(windowInstance.
                                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                       super__Vector_impl_data._M_start._1_7_,
                                       windowInstance.
                                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                       super__Vector_impl_data._M_start._0_1_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)executableName._M_dataplus._M_p != &executableName.field_2) {
      operator_delete(executableName._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

WindowImplX11::WindowImplX11(VideoMode mode, const String& title, unsigned long style, const ContextSettings& settings) :
m_window         (0),
m_screen         (0),
m_inputMethod    (NULL),
m_inputContext   (NULL),
m_isExternal     (false),
m_oldVideoMode   (0),
m_oldRRCrtc      (0),
m_hiddenCursor   (0),
m_lastCursor     (None),
m_keyRepeat      (true),
m_previousSize   (-1, -1),
m_useSizeHints   (false),
m_fullscreen     ((style & Style::Fullscreen) != 0),
m_cursorGrabbed  (m_fullscreen),
m_windowMapped   (false),
m_iconPixmap     (0),
m_iconMaskPixmap (0),
m_lastInputTime  (0)
{
    using namespace WindowsImplX11Impl;

    // Open a connection with the X server
    m_display = OpenDisplay();

    // Make sure to check for EWMH support before we do anything
    ewmhSupported();

    m_screen = DefaultScreen(m_display);

    // Compute position and size
    Vector2i windowPosition;
    if(m_fullscreen)
    {
        windowPosition = getPrimaryMonitorPosition();
    }
    else
    {
        windowPosition.x = (DisplayWidth(m_display, m_screen) - static_cast<int>(mode.width))  / 2;
        windowPosition.y = (DisplayHeight(m_display, m_screen) - static_cast<int>(mode.height)) / 2;
    }

    unsigned int width  = mode.width;
    unsigned int height = mode.height;

    Visual* visual = NULL;
    int depth = 0;

    // Check if the user chose to not create an OpenGL context (settings.attributeFlags will be 0xFFFFFFFF)
    if (settings.attributeFlags == 0xFFFFFFFF)
    {
        // Choose default visual since the user is going to use their own rendering API
        visual = DefaultVisual(m_display, m_screen);
        depth = DefaultDepth(m_display, m_screen);
    }
    else
    {
        // Choose the visual according to the context settings
        XVisualInfo visualInfo = ContextType::selectBestVisual(m_display, mode.bitsPerPixel, settings);

        visual = visualInfo.visual;
        depth = visualInfo.depth;
    }

    // Define the window attributes
    XSetWindowAttributes attributes;
    attributes.colormap = XCreateColormap(m_display, DefaultRootWindow(m_display), visual, AllocNone);
    attributes.event_mask = eventMask;
    attributes.override_redirect = (m_fullscreen && !ewmhSupported()) ? True : False;

    m_window = XCreateWindow(m_display,
                             DefaultRootWindow(m_display),
                             windowPosition.x, windowPosition.y,
                             width, height,
                             0,
                             depth,
                             InputOutput,
                             visual,
                             CWEventMask | CWOverrideRedirect | CWColormap,
                             &attributes);

    if (!m_window)
    {
        err() << "Failed to create window" << std::endl;
        return;
    }

    // Set the WM protocols
    setProtocols();

    // Set the WM initial state to the normal state
    XWMHints* xHints = XAllocWMHints();
    xHints->flags         = StateHint;
    xHints->initial_state = NormalState;
    XSetWMHints(m_display, m_window, xHints);
    XFree(xHints);

    // If not in fullscreen, set the window's style (tell the window manager to
    // change our window's decorations and functions according to the requested style)
    if (!m_fullscreen)
    {
        Atom WMHintsAtom = getAtom("_MOTIF_WM_HINTS", false);
        if (WMHintsAtom)
        {
            static const unsigned long MWM_HINTS_FUNCTIONS   = 1 << 0;
            static const unsigned long MWM_HINTS_DECORATIONS = 1 << 1;

            //static const unsigned long MWM_DECOR_ALL         = 1 << 0;
            static const unsigned long MWM_DECOR_BORDER      = 1 << 1;
            static const unsigned long MWM_DECOR_RESIZEH     = 1 << 2;
            static const unsigned long MWM_DECOR_TITLE       = 1 << 3;
            static const unsigned long MWM_DECOR_MENU        = 1 << 4;
            static const unsigned long MWM_DECOR_MINIMIZE    = 1 << 5;
            static const unsigned long MWM_DECOR_MAXIMIZE    = 1 << 6;

            //static const unsigned long MWM_FUNC_ALL          = 1 << 0;
            static const unsigned long MWM_FUNC_RESIZE       = 1 << 1;
            static const unsigned long MWM_FUNC_MOVE         = 1 << 2;
            static const unsigned long MWM_FUNC_MINIMIZE     = 1 << 3;
            static const unsigned long MWM_FUNC_MAXIMIZE     = 1 << 4;
            static const unsigned long MWM_FUNC_CLOSE        = 1 << 5;

            struct WMHints
            {
                unsigned long flags;
                unsigned long functions;
                unsigned long decorations;
                long          inputMode;
                unsigned long state;
            };

            WMHints hints;
            std::memset(&hints, 0, sizeof(hints));
            hints.flags       = MWM_HINTS_FUNCTIONS | MWM_HINTS_DECORATIONS;
            hints.decorations = 0;
            hints.functions   = 0;

            if (style & Style::Titlebar)
            {
                hints.decorations |= MWM_DECOR_BORDER | MWM_DECOR_TITLE | MWM_DECOR_MINIMIZE | MWM_DECOR_MENU;
                hints.functions   |= MWM_FUNC_MOVE | MWM_FUNC_MINIMIZE;
            }
            if (style & Style::Resize)
            {
                hints.decorations |= MWM_DECOR_MAXIMIZE | MWM_DECOR_RESIZEH;
                hints.functions   |= MWM_FUNC_MAXIMIZE | MWM_FUNC_RESIZE;
            }
            if (style & Style::Close)
            {
                hints.decorations |= 0;
                hints.functions   |= MWM_FUNC_CLOSE;
            }

            XChangeProperty(m_display,
                            m_window,
                            WMHintsAtom,
                            WMHintsAtom,
                            32,
                            PropModeReplace,
                            reinterpret_cast<const unsigned char*>(&hints),
                            5);
        }
    }

    // This is a hack to force some windows managers to disable resizing
    if (!(style & Style::Resize))
    {
        m_useSizeHints = true;
        XSizeHints* sizeHints = XAllocSizeHints();
        sizeHints->flags = PMinSize | PMaxSize | USPosition;
        sizeHints->min_width  = sizeHints->max_width  = static_cast<int>(width);
        sizeHints->min_height = sizeHints->max_height = static_cast<int>(height);
        sizeHints->x = windowPosition.x;
        sizeHints->y = windowPosition.y;
        XSetWMNormalHints(m_display, m_window, sizeHints);
        XFree(sizeHints);
    }

    // Set the window's WM class (this can be used by window managers)
    XClassHint* hint = XAllocClassHint();

    // The instance name should be something unique to this invocation
    // of the application but is rarely if ever used these days.
    // For simplicity, we retrieve it via the base executable name.
    std::string executableName = findExecutableName();
    std::vector<char> windowInstance(executableName.size() + 1, 0);
    std::copy(executableName.begin(), executableName.end(), windowInstance.begin());
    hint->res_name = &windowInstance[0];

    // The class name identifies a class of windows that
    // "are of the same type". We simply use the initial window name as
    // the class name.
    std::string ansiTitle = title.toAnsiString();
    std::vector<char> windowClass(ansiTitle.size() + 1, 0);
    std::copy(ansiTitle.begin(), ansiTitle.end(), windowClass.begin());
    hint->res_class = &windowClass[0];

    XSetClassHint(m_display, m_window, hint);

    XFree(hint);

    // Set the window's name
    setTitle(title);

    // Do some common initializations
    initialize();

    // Set fullscreen video mode and switch to fullscreen if necessary
    if (m_fullscreen)
    {
        // Disable hint for min and max size,
        // otherwise some windows managers will not remove window decorations
        XSizeHints *sizeHints = XAllocSizeHints();
        long flags = 0;
        XGetWMNormalHints(m_display, m_window, sizeHints, &flags);
        sizeHints->flags &= ~(PMinSize | PMaxSize);
        XSetWMNormalHints(m_display, m_window, sizeHints);
        XFree(sizeHints);

        setVideoMode(mode);
        switchToFullscreen();
    }
}